

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O2

void tlbi_aa64_vmalle1_write(CPUARMState_conflict *env,ARMCPRegInfo_conflict *ri,uint64_t value)

{
  CPUState *cpu;
  _Bool _Var1;
  int iVar2;
  CPUARMState_conflict *__mptr;
  
  cpu = (CPUState *)(env[-4].vfp.zregs[0x17].d + 0x14);
  iVar2 = vae1_tlbmask(env);
  _Var1 = tlb_force_broadcast(env);
  if (_Var1) {
    tlb_flush_by_mmuidx_all_cpus_synced_aarch64(cpu,(uint16_t)iVar2);
    return;
  }
  tlb_flush_by_mmuidx_aarch64(cpu,(uint16_t)iVar2);
  return;
}

Assistant:

static void tlbi_aa64_vmalle1_write(CPUARMState *env, const ARMCPRegInfo *ri,
                                    uint64_t value)
{
    CPUState *cs = env_cpu(env);
    int mask = vae1_tlbmask(env);

    if (tlb_force_broadcast(env)) {
        tlb_flush_by_mmuidx_all_cpus_synced(cs, mask);
    } else {
        tlb_flush_by_mmuidx(cs, mask);
    }
}